

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void sect_AbsLongGroup(uint8_t *s,size_t length)

{
  bool bVar1;
  size_t sVar2;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    bVar1 = reserveSpace((int)length * 4);
    if ((length != 0) && (bVar1)) {
      sVar2 = 0;
      do {
        writelong((uint)s[sVar2]);
        sVar2 = sVar2 + 1;
      } while (length != sVar2);
    }
  }
  return;
}

Assistant:

void sect_AbsLongGroup(uint8_t const *s, size_t length)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(length * 4))
		return;

	while (length--)
		writelong(*s++);
}